

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

_Bool al_resize_display(ALLEGRO_DISPLAY *display,int width,int height)

{
  _Bool _Var1;
  byte bVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  char *in_stack_00000028;
  int in_stack_00000034;
  char *in_stack_00000038;
  int in_stack_00000044;
  char *in_stack_00000048;
  _Bool local_1;
  
  _Var1 = _al_trace_prefix(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000034,
                           in_stack_00000028);
  if (_Var1) {
    _al_trace_suffix("Requested display resize %dx%d+%d\n",(ulong)in_ESI,(ulong)in_EDX,
                     (ulong)*(uint *)(in_RDI + 0x274));
  }
  if (*(long *)(*(long *)(in_RDI + 0x80) + 0x50) == 0) {
    local_1 = false;
  }
  else {
    bVar2 = (**(code **)(*(long *)(in_RDI + 0x80) + 0x50))
                      (in_RDI,in_ESI,in_EDX + *(int *)(in_RDI + 0x274));
    local_1 = (_Bool)(bVar2 & 1);
  }
  return local_1;
}

Assistant:

bool al_resize_display(ALLEGRO_DISPLAY *display, int width, int height)
{
   ASSERT(display);
   ASSERT(display->vt);

   ALLEGRO_INFO("Requested display resize %dx%d+%d\n", width, height, display->extra_resize_height);

   if (display->vt->resize_display) {
      return display->vt->resize_display(display, width, height + display->extra_resize_height);
   }
   return false;
}